

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void suboption(connectdata *conn)

{
  char cVar1;
  SessionHandle *data;
  char *pcVar2;
  FormData *__s;
  size_t sVar3;
  long lVar4;
  uint *puVar5;
  undefined8 uVar6;
  HTTP *pHVar7;
  FormData *pFVar8;
  size_t length;
  ulong uVar9;
  char varval [128];
  char varname [128];
  uchar temp [2048];
  
  data = conn->data;
  pHVar7 = (data->state).proto.http;
  printsub(data,0x3c,(uchar *)&pHVar7[0x36].postsize,
           (*(long *)&pHVar7[0x39].sending - pHVar7[0x39].backup.postsize) + 2);
  pcVar2 = (char *)pHVar7[0x39].backup.postsize;
  pHVar7[0x39].backup.postsize = (curl_off_t)(pcVar2 + 1);
  cVar1 = *pcVar2;
  if (cVar1 == '\'') {
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c",0xff,0xfa,0x27,0);
    pFVar8 = pHVar7[0x36].sendit;
    if (pFVar8 == (FormData *)0x0) {
      length = 4;
    }
    else {
      length = 4;
      do {
        __s = pFVar8->next;
        sVar3 = strlen((char *)__s);
        uVar9 = length + sVar3 + 1;
        if (uVar9 < 0x7fa) {
          __isoc99_sscanf(__s,"%127[^,],%127s",varname,varval);
          curl_msnprintf((char *)(temp + length),0x800 - length,"%c%s%c%s",0,varname,1,varval);
          length = uVar9;
        }
        pFVar8 = *(FormData **)&pFVar8->type;
      } while (pFVar8 != (FormData *)0x0);
    }
    curl_msnprintf((char *)(temp + length),0x800 - length,"%c%c",0xff,0xf0);
    lVar4 = send(conn->sock[0],temp,length + 2,0x4000);
  }
  else {
    if (cVar1 == '#') {
      pHVar7 = pHVar7 + 0x35;
      sVar3 = strlen((char *)pHVar7);
      uVar6 = 0x23;
    }
    else {
      if (cVar1 != '\x18') {
        return;
      }
      pHVar7 = (HTTP *)&pHVar7[0x34].backup.postdata;
      sVar3 = strlen((char *)pHVar7);
      uVar6 = 0x18;
    }
    length = sVar3 + 4;
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,uVar6,0,pHVar7,0xff,0xf0);
    lVar4 = send(conn->sock[0],temp,sVar3 + 6,0x4000);
  }
  if (lVar4 < 0) {
    puVar5 = (uint *)__errno_location();
    Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar5);
  }
  printsub(data,0x3e,temp + 2,length);
  return;
}

Assistant:

static void suboption(struct connectdata *conn)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  size_t tmplen;
  int err;
  char varname[128];
  char varval[128];
  struct SessionHandle *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->state.proto.telnet;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn)+2);
  switch (CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
               CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
               CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
               CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars;v;v = v->next) {
        tmplen = (strlen(v->data) + 1);
        /* Add the variable only if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          sscanf(v->data, "%127[^,],%127s", varname, varval);
          snprintf((char *)&temp[len], sizeof(temp) - len,
                   "%c%s%c%s", CURL_NEW_ENV_VAR, varname,
                   CURL_NEW_ENV_VALUE, varval);
          len += tmplen;
        }
      }
      snprintf((char *)&temp[len], sizeof(temp) - len,
               "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}